

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O3

Eci * __thiscall
libsgp4::SGP4::FindPositionSDP4(Eci *__return_storage_ptr__,SGP4 *this,double tsince)

{
  double dVar1;
  SatelliteException *this_00;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double __x;
  double dVar5;
  double dVar6;
  double dVar7;
  double omgadf;
  double xinc;
  double xnode;
  double local_78;
  undefined8 uStack_70;
  double local_60;
  double local_58;
  double xmam;
  double em;
  double xmdf;
  DateTime local_38;
  double xn;
  double local_28;
  
  xmdf = *(double *)(this + 0x70) * tsince + *(double *)(this + 0x268);
  omgadf = *(double *)(this + 0x60) * tsince + *(double *)(this + 0x278);
  xnode = *(double *)(this + 0x48) * tsince * tsince +
          *(double *)(this + 0x68) * tsince + *(double *)(this + 0x270);
  dVar6 = *(double *)(this + 0x18);
  local_78 = *(double *)(this + 0x50);
  dVar5 = *(double *)(this + 0x298);
  dVar1 = *(double *)(this + 0x58);
  xn = *(double *)(this + 0x2a8);
  em = *(double *)(this + 0x280);
  xinc = *(double *)(this + 0x288);
  DeepSpaceSecular(tsince,(OrbitalElements *)(this + 0x268),(CommonConstants *)this,
                   (DeepSpaceConstants *)(this + 0xd0),(IntegratorParams *)(this + 0x250),&xmdf,
                   &omgadf,&xnode,&em,&xinc,&xn);
  if (xn <= 0.0) {
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Error: (xn <= 0.0)");
  }
  else {
    dVar3 = pow(kXKE / xn,0.6666666666666666);
    local_28 = em - dVar5 * dVar1 * tsince;
    xmam = tsince * tsince * dVar6 * *(double *)(this + 0x2a8) + xmdf;
    DeepSpacePeriodics(tsince,(DeepSpaceConstants *)(this + 0xd0),&local_28,&xinc,&omgadf,&xnode,
                       &xmam);
    if (-0.001 < local_28) {
      dVar6 = 1e-06;
      if ((1e-06 <= local_28) && (dVar6 = local_28, 0.999999 < local_28)) {
        dVar6 = 0.999999;
      }
      dVar4 = -xinc;
      dVar5 = (double)(~-(ulong)(xinc < dVar4) & (ulong)omgadf |
                      (ulong)(omgadf + -3.141592653589793) & -(ulong)(xinc < dVar4));
      __x = xinc;
      dVar1 = xnode;
      if (xinc < dVar4) {
        __x = dVar4;
        dVar1 = xnode + 3.141592653589793;
      }
      local_58 = xmam + dVar5 + dVar1;
      dVar7 = 1.0 - local_78 * tsince;
      uStack_70 = 0;
      local_78 = dVar5;
      local_60 = sin(__x);
      dVar5 = cos(__x);
      dVar4 = dVar5 * dVar5;
      uVar2 = -(ulong)(1.5e-12 < ABS(dVar5 + 1.0));
      local_38.m_encoded = (long)(tsince * 60000000.0) + *(long *)(this + 0x2c0);
      CalculateFinalPositionVelocity
                (__return_storage_ptr__,&local_38,dVar6,dVar3 * dVar7 * dVar7,local_78,local_58,
                 dVar1,__x,
                 ((dVar5 * 5.0 + 3.0) * local_60 * 0.000586267430002882) /
                 (double)(~uVar2 & 0x3d7a636641c4df1a | (ulong)(dVar5 + 1.0) & uVar2),
                 local_60 * 0.001172534860005764,dVar4 * 3.0 + -1.0,1.0 - dVar4,dVar4 * 7.0 + -1.0,
                 dVar5,local_60);
      return __return_storage_ptr__;
    }
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Error: (e <= -0.001)");
  }
  __cxa_throw(this_00,&SatelliteException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Eci SGP4::FindPositionSDP4(double tsince) const
{
    /*
     * the final values
     */
    double e;
    double a;
    double omega;
    double xl;
    double xnode;
    double xinc;

    /*
     * update for secular gravity and atmospheric drag
     */
    double xmdf = elements_.MeanAnomoly()
        + common_consts_.xmdot * tsince;
    double omgadf = elements_.ArgumentPerigee()
        + common_consts_.omgdot * tsince;
    const double xnoddf = elements_.AscendingNode()
        + common_consts_.xnodot * tsince;

    const double tsq = tsince * tsince;
    xnode = xnoddf + common_consts_.xnodcf * tsq;
    double tempa = 1.0 - common_consts_.c1 * tsince;
    double tempe = elements_.BStar() * common_consts_.c4 * tsince;
    double templ = common_consts_.t2cof * tsq;

    double xn = elements_.RecoveredMeanMotion();
    double em = elements_.Eccentricity();
    xinc = elements_.Inclination();

    DeepSpaceSecular(tsince,
                     elements_,
                     common_consts_,
                     deepspace_consts_,
                     integrator_params_,
                     xmdf,
                     omgadf,
                     xnode,
                     em,
                     xinc,
                     xn);

    if (xn <= 0.0)
    {
        throw SatelliteException("Error: (xn <= 0.0)");
    }

    a = pow(kXKE / xn, kTWOTHIRD) * tempa * tempa;
    e = em - tempe;
    double xmam = xmdf + elements_.RecoveredMeanMotion() * templ;

    DeepSpacePeriodics(tsince,
                       deepspace_consts_,
                       e,
                       xinc,
                       omgadf,
                       xnode,
                       xmam);

    /*
     * keeping xinc positive important unless you need to display xinc
     * and dislike negative inclinations
     */
    if (xinc < 0.0)
    {
        xinc = -xinc;
        xnode += kPI;
        omgadf -= kPI;
    }

    xl = xmam + omgadf + xnode;
    omega = omgadf;

    /*
     * fix tolerance for error recognition
     */
    if (e <= -0.001)
    {
        throw SatelliteException("Error: (e <= -0.001)");
    }
    else if (e < 1.0e-6)
    {
        e = 1.0e-6;
    }
    else if (e > (1.0 - 1.0e-6))
    {
        e = 1.0 - 1.0e-6;
    }

    /*
     * re-compute the perturbed values
     */
    double perturbed_sinio;
    double perturbed_cosio;
    double perturbed_x3thm1;
    double perturbed_x1mth2;
    double perturbed_x7thm1;
    double perturbed_xlcof;
    double perturbed_aycof;
    RecomputeConstants(xinc,
                       perturbed_sinio,
                       perturbed_cosio,
                       perturbed_x3thm1,
                       perturbed_x1mth2,
                       perturbed_x7thm1,
                       perturbed_xlcof,
                       perturbed_aycof);

    /*
     * using calculated values, find position and velocity
     */
    return CalculateFinalPositionVelocity(elements_.Epoch().AddMinutes(tsince),
                                          e,
                                          a,
                                          omega,
                                          xl,
                                          xnode,
                                          xinc,
                                          perturbed_xlcof,
                                          perturbed_aycof,
                                          perturbed_x3thm1,
                                          perturbed_x1mth2,
                                          perturbed_x7thm1,
                                          perturbed_cosio,
                                          perturbed_sinio);
}